

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTerminal.c
# Opt level: O1

int testTerminal(int argc,char **argv)

{
  cmsysTerminal_cfprintf(0x454,(FILE *)_stdout,"Hello %s!","World");
  fputc(10,_stdout);
  return 0;
}

Assistant:

int testTerminal(int argc, char* argv[])
{
  (void)argc;
  (void)argv;
  kwsysTerminal_cfprintf(kwsysTerminal_Color_ForegroundYellow |
                         kwsysTerminal_Color_BackgroundBlue |
                         kwsysTerminal_Color_AssumeTTY,
                         stdout, "Hello %s!", "World");
  fprintf(stdout, "\n");
  return 0;
}